

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O2

void modifyChannels<Imath_3_2::half>
               (list<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
                *channels,half delta)

{
  long lVar1;
  long lVar2;
  int y;
  long lVar3;
  int x;
  long lVar4;
  _List_node_base *p_Var5;
  
  p_Var5 = (_List_node_base *)channels;
  while (p_Var5 = (((_List_base<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
                     *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != (_List_node_base *)channels) {
    lVar2 = 0;
    for (lVar3 = 0; lVar3 < (long)p_Var5[1]._M_next; lVar3 = lVar3 + 1) {
      lVar1 = 0;
      for (lVar4 = 0; lVar4 < (long)p_Var5[1]._M_prev; lVar4 = lVar4 + 1) {
        Imath_3_2::half::operator+=
                  ((half *)((long)p_Var5[2]._M_next + lVar1 + (long)p_Var5[1]._M_prev * lVar2),delta
                  );
        lVar1 = lVar1 + 2;
      }
      lVar2 = lVar2 + 2;
    }
  }
  return;
}

Assistant:

void
modifyChannels (list<Array2D<T>>& channels, T delta)
{
    //
    // Dummy code modifying each pixel by incrementing every channel by a given delta.
    //

    for (auto i = channels.begin (); i != channels.end (); i++)
    {
        Array2D<T>& channel = *i;

        for (int y = 0; y < channel.height (); y++)
        {
            for (int x = 0; x < channel.width (); x++)
            {
                channel[y][x] += delta;
            }
        }
    }
}